

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

void __thiscall xemmai::ast::t_while::f_flow(t_while *this,t_flow *a_flow)

{
  t_block *a_next;
  t_block *a_next_00;
  t_node *ptVar1;
  t_targets *ptVar2;
  pointer puVar3;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  pointer puVar4;
  t_block *a_next_01;
  t_targets targets1;
  t_targets local_48;
  
  a_next = &this->v_junction_condition;
  t_block::f_next(a_flow->v_current,a_next);
  t_block::f_next(a_next,&this->v_block_condition);
  a_flow->v_current = &this->v_block_condition;
  ptVar1 = (this->v_condition)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[2])(ptVar1,a_flow);
  a_next_01 = &this->v_block_block;
  t_block::f_next(a_flow->v_current,a_next_01);
  a_next_00 = &this->v_junction_exit;
  t_block::f_next(a_flow->v_current,a_next_00);
  ptVar2 = a_flow->v_targets;
  local_48.v_return = ptVar2->v_return;
  a_flow->v_targets = &local_48;
  a_flow->v_current = a_next_01;
  puVar4 = (this->v_block).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->v_block).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48.v_break = a_next_00;
  local_48.v_continue = a_next;
  if (puVar4 != puVar3) {
    do {
      ptVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar1->_vptr_t_node[2])(ptVar1,a_flow);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar3);
    a_next_01 = a_flow->v_current;
  }
  a_flow->v_targets = ptVar2;
  t_block::f_next(a_next_01,a_next);
  t_block::f_next(a_next_00,&this->v_block_exit);
  a_flow->v_current = &this->v_block_exit;
  return;
}

Assistant:

void t_while::f_flow(t_flow& a_flow)
{
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_condition.f_next(&v_block_condition);
	a_flow.v_current = &v_block_condition;
	v_condition->f_flow(a_flow);
	a_flow.v_current->f_next(&v_block_block);
	a_flow.v_current->f_next(&v_junction_exit);
	auto targets0 = a_flow.v_targets;
	t_flow::t_targets targets1{&v_junction_exit, &v_junction_condition, targets0->v_return};
	a_flow.v_targets = &targets1;
	a_flow.v_current = &v_block_block;
	for (auto& p : v_block) p->f_flow(a_flow);
	a_flow.v_targets = targets0;
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_exit.f_next(&v_block_exit);
	a_flow.v_current = &v_block_exit;
}